

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.h
# Opt level: O3

bool __thiscall
cmLocalGenerator::AllAppleArchSysrootsAreTheSame
          (cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archs,cmValue sysroot)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar3;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmLocalGenerator *local_40;
  string *local_38;
  
  if (sysroot.Value == (string *)0x0) {
    return false;
  }
  __it._M_current =
       (archs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (archs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar1 - (long)__it._M_current;
  local_40 = this;
  local_38 = sysroot.Value;
  if (0 < lVar4 >> 7) {
    lVar3 = (lVar4 >> 7) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_40,__it);
      _Var5._M_current = __it._M_current;
      if (bVar2) goto LAB_00490880;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_40,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_00490880;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_40,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_00490880;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_40,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_00490880;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x80;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pbVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
                  ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                                *)&local_40,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_00490880;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
            ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                          *)&local_40,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00490880;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
          ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                        *)&local_40,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar2) {
    _Var5._M_current = pbVar1;
  }
LAB_00490880:
  return _Var5._M_current == pbVar1;
}

Assistant:

explicit operator bool() const noexcept { return this->Value != nullptr; }